

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::store
          (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this,ostream *_ostr,bool _swap)

{
  pointer pVVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])
                    (this,_ostr,CONCAT71(in_register_00000011,_swap));
  if (CONCAT44(extraout_var,iVar2) == 0) {
    sVar5 = 0;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    sVar5 = 0;
    do {
      pVVar1 = (this->data_).
               super__Vector_base<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uStack_38 = CONCAT26(CONCAT11(uStack_38._7_1_,
                                    (pVVar1->super_VectorDataT<unsigned_char,_3>).values_[lVar4 + 2]
                                   ),
                           CONCAT24(*(undefined2 *)
                                     ((pVVar1->super_VectorDataT<unsigned_char,_3>).values_ + lVar4)
                                    ,(undefined4)uStack_38));
      std::ostream::write((char *)_ostr,(long)&uStack_38 + 4);
      sVar5 = sVar5 + (ulong)(*(int *)(&_ostr->field_0x20 + (long)_ostr->_vptr_basic_ostream[-3]) ==
                             0) * 3;
      uVar3 = uVar3 + 1;
      iVar2 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
      lVar4 = lVar4 + 3;
    } while (uVar3 < CONCAT44(extraout_var_00,iVar2));
  }
  return sVar5;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }